

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O1

Executor * get_executor(void)

{
  int iVar1;
  uint uVar2;
  shared_ptr<tf::WorkerInterface> local_18;
  
  if (get_executor()::executor == '\0') {
    iVar1 = __cxa_guard_acquire(&get_executor()::executor);
    if (iVar1 != 0) {
      uVar2 = std::thread::hardware_concurrency();
      local_18.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_18.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      tf::Executor::Executor(&get_executor::executor,(ulong)uVar2,&local_18);
      if (local_18.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_18.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __cxa_atexit(tf::Executor::~Executor,&get_executor::executor,&__dso_handle);
      __cxa_guard_release(&get_executor()::executor);
    }
  }
  return &get_executor::executor;
}

Assistant:

tf::Executor& get_executor() {
  static tf::Executor executor;
  return executor;
}